

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkSopEsopCover(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax,int fUseEsop,int fUseSop,
                   int fUseInvs,int fVerbose)

{
  bool bVar1;
  Cov_Man_t *p;
  abctime aVar2;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  abctime aVar6;
  char *p_00;
  void **ppvVar7;
  ProgressBar *p_01;
  long *plVar8;
  abctime aVar9;
  Abc_Ntk_t *pNtk_00;
  int iVar10;
  uint uVar11;
  int iVar12;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                  ,0x41,"Abc_Ntk_t *Abc_NtkSopEsopCover(Abc_Ntk_t *, int, int, int, int, int, int)")
    ;
  }
  p = Cov_ManAlloc(pNtk,nFaninMax,nCubesMax);
  p->fUseEsop = fUseEsop;
  p->fUseSop = fUseSop;
  pNtk->pManCut = p;
  aVar2 = Abc_Clock();
  pVVar3 = Abc_NtkFanoutCounts(pNtk);
  p->vFanCounts = pVVar3;
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar4->field_0x14 = pAVar4->field_0x14 | 0x10;
  for (iVar10 = 0; iVar10 < pNtk->vCis->nSize; iVar10 = iVar10 + 1) {
    pvVar5 = Vec_PtrEntry(pNtk->vCis,iVar10);
    *(byte *)((long)pvVar5 + 0x14) = *(byte *)((long)pvVar5 + 0x14) | 0x10;
  }
  iVar10 = 0;
  do {
    if (fVerbose != 0) {
      printf("Iter %d : ",(ulong)(iVar10 + 1));
    }
    aVar6 = Abc_Clock();
    p_00 = (char *)malloc(0x10);
    ((Abc_Ntk_t *)p_00)->ntkType = 100;
    ((Abc_Ntk_t *)p_00)->ntkFunc = ABC_FUNC_NONE;
    ppvVar7 = (void **)malloc(800);
    ((Abc_Ntk_t *)p_00)->pName = (char *)ppvVar7;
    p_01 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    uVar11 = 0;
    bVar1 = true;
    for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
      plVar8 = (long *)Vec_PtrEntry(pNtk->vCos,iVar12);
      if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar12)) {
        Extra_ProgressBarUpdate_int(p_01,iVar12,(char *)0x0);
      }
      pAVar4 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar8 + 0x20) + 8) + (long)*(int *)plVar8[4] * 8);
      if ((pAVar4->field_0x14 & 0x10) == 0) {
        pVVar3 = Abc_ObjGetSupp(pAVar4);
        if (pVVar3 == (Vec_Int_t *)0x0) {
          Abc_NtkCovCovers_rec(p,pAVar4,(Vec_Ptr_t *)p_00);
        }
        pVVar3 = Abc_ObjGetSupp(pAVar4);
        if (pVVar3 == (Vec_Int_t *)0x0) {
          bVar1 = false;
        }
        uVar11 = uVar11 + (pVVar3 != (Vec_Int_t *)0x0);
      }
      else {
        uVar11 = uVar11 + 1;
      }
    }
    Extra_ProgressBarStop(p_01);
    for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar12);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        pAVar4->field_0x14 = pAVar4->field_0x14 & 0xdf;
      }
    }
    p->nBoundary = 0;
    for (iVar12 = 0; iVar12 < (int)((Abc_Ntk_t *)p_00)->ntkFunc; iVar12 = iVar12 + 1) {
      pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar12);
      if ((*(uint *)((long)pvVar5 + 0x14) & 0x10) == 0) {
        *(uint *)((long)pvVar5 + 0x14) = *(uint *)((long)pvVar5 + 0x14) | 0x10;
        p->nBoundary = p->nBoundary + 1;
      }
    }
    free(((Abc_Ntk_t *)p_00)->pName);
    free(p_00);
    if (fVerbose != 0) {
      p_00 = "Outs = %4d (%4d) Node = %6d (%6d) Max = %6d  Bound = %4d  ";
      printf("Outs = %4d (%4d) Node = %6d (%6d) Max = %6d  Bound = %4d  ",(ulong)uVar11,
             (ulong)(uint)pNtk->vCos->nSize,(ulong)(uint)p->nSupps,(ulong)(uint)pNtk->nObjCounts[7],
             (ulong)(uint)p->nSuppsMax,p->nBoundary);
      Abc_Print((int)p_00,"%s =","T");
      aVar9 = Abc_Clock();
      Abc_Print((int)p_00,"%9.2f sec\n",(double)(aVar9 - aVar6) / 1000000.0);
    }
    iVar10 = iVar10 + 1;
  } while (!bVar1);
  for (iVar10 = 0; iVar12 = (int)p_00, iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
    p_00 = (char *)pNtk;
    pAVar4 = Abc_NtkObj(pNtk,iVar10);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      pAVar4->field_0x14 = pAVar4->field_0x14 & 0xef;
    }
  }
  if (fVerbose != 0) {
    Abc_Print(iVar12,"%s =","Total");
    aVar6 = Abc_Clock();
    Abc_Print(iVar12,"%9.2f sec\n",(double)(aVar6 - aVar2) / 1000000.0);
  }
  pNtk_00 = Abc_NtkCovDeriveRegular(p,pNtk);
  Cov_ManFree(p);
  pNtk->pManCut = (void *)0x0;
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    iVar10 = Abc_NtkCheck(pNtk_00);
    if (iVar10 != 0) {
      return pNtk_00;
    }
    puts("Abc_NtkCov: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkSopEsopCover( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax, int fUseEsop, int fUseSop, int fUseInvs, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Cov_Man_t * p;

    assert( Abc_NtkIsStrash(pNtk) );

    // create the manager
    p = Cov_ManAlloc( pNtk, nFaninMax, nCubesMax );
    p->fUseEsop = fUseEsop;
    p->fUseSop  = fUseSop;
    pNtk->pManCut = p;

    // perform mapping
    Abc_NtkCovCovers( p, pNtk, fVerbose );

    // derive the final network
//    if ( fUseInvs )
//        pNtkNew = Abc_NtkCovDeriveClean( p, pNtk );
//      else
//       pNtkNew = Abc_NtkCovDerive( p, pNtk );
//    pNtkNew = NULL;
    pNtkNew = Abc_NtkCovDeriveRegular( p, pNtk );

    Cov_ManFree( p );
    pNtk->pManCut = NULL;

    // make sure that everything is okay
    if ( pNtkNew && !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCov: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}